

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O1

int Gia_ObjFaninLit0(Gia_Obj_t *pObj,int ObjId)

{
  int iVar1;
  
  iVar1 = ObjId - (*(uint *)pObj & 0x1fffffff);
  if (-1 < iVar1) {
    return (*(uint *)pObj >> 0x1d & 1) + iVar1 * 2;
  }
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

static inline int          Gia_ObjFaninId0( Gia_Obj_t * pObj, int ObjId )      { return ObjId - pObj->iDiff0;    }